

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_astring.c
# Opt level: O0

void test_AString_substring_reallocationFailed_fn(int _i)

{
  AString string_00;
  int iVar1;
  AString *pAVar2;
  char *in_stack_fffffffffffffec0;
  uintmax_t _ck_y_5;
  uintmax_t _ck_x_9;
  char *_ck_y_q_1;
  char *_ck_x_q_1;
  char *_ck_y_s_1;
  char *_ck_x_s_1;
  char *_ck_y_4;
  char *_ck_x_8;
  void *_ck_x_7;
  uintmax_t _ck_y_3;
  uintmax_t _ck_x_6;
  void *_ck_x_5;
  uintmax_t _ck_y_2;
  uintmax_t _ck_x_4;
  char *_ck_y_q;
  char *_ck_x_q;
  char *_ck_y_s;
  char *_ck_x_s;
  char *_ck_y_1;
  char *_ck_x_3;
  void *_ck_x_2;
  uintmax_t _ck_y;
  uintmax_t _ck_x_1;
  void *_ck_x;
  AString *substring;
  AString string;
  int _i_local;
  
  string.buffer._4_4_ = _i;
  private_ACUtilsTest_AString_constructTestString((AString *)&substring,"xxxx01234567xxxx",0x10);
  private_ACUtilsTest_AString_setReallocFail(true,0);
  pAVar2 = AString_substring((AString *)&substring,0,0xffffffffffffffff);
  if (pAVar2 != (AString *)0x0) {
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x9cf,"Assertion \'_ck_x == NULL\' failed",
                      "Assertion \'%s\' failed: %s == %#x","(void*) substring == NULL",
                      "(void*) substring",pAVar2,0);
  }
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x9cf);
  if (string.size != 0x10) {
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x9d0,"Assertion \'_ck_x == _ck_y\' failed",
                      "Assertion \'%s\' failed: %s == %ju, %s == %ju","(string).capacity == (16)",
                      "(string).capacity",string.size,"(16)",0x10,0);
  }
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x9d0);
  if (string.capacity == 0) {
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x9d0,"Assertion \'_ck_x != NULL\' failed",
                      "Assertion \'%s\' failed: %s == %#x","(void*) (string).buffer != NULL",
                      "(void*) (string).buffer",0,0);
  }
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x9d0);
  _ck_y_s = (char *)string.capacity;
  if (string.capacity == 0) {
    _ck_y_q = "";
    _ck_y_s = "(null)";
  }
  else {
    _ck_y_q = "\"";
    iVar1 = strcmp("xxxx01234567xxxx",(char *)string.capacity);
    if (iVar1 == 0) {
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x9d0);
      if (string.deallocator != (ACUtilsDeallocator)0x10) {
        _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x9d0,"Assertion \'_ck_x == _ck_y\' failed",
                          "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                          "(string).size == strlen(\"xxxx01234567xxxx\")","(string).size",
                          string.deallocator,"strlen(\"xxxx01234567xxxx\")",0x10,0);
      }
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x9d0);
      private_ACUtilsTest_AString_setReallocFail(true,1);
      pAVar2 = AString_substring((AString *)&substring,0,0xffffffffffffffff);
      if (pAVar2 != (AString *)0x0) {
        _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x9d3,"Assertion \'_ck_x == NULL\' failed",
                          "Assertion \'%s\' failed: %s == %#x","(void*) substring == NULL",
                          "(void*) substring",pAVar2,0);
      }
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x9d3);
      if (string.size != 0x10) {
        _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x9d4,"Assertion \'_ck_x == _ck_y\' failed",
                          "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                          "(string).capacity == (16)","(string).capacity",string.size,"(16)",0x10,0)
        ;
      }
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x9d4);
      if (string.capacity != 0) {
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,0x9d4);
        _ck_y_s_1 = (char *)string.capacity;
        if (string.capacity == 0) {
          _ck_y_q_1 = "";
          _ck_y_s_1 = "(null)";
        }
        else {
          _ck_y_q_1 = "\"";
          iVar1 = strcmp("xxxx01234567xxxx",(char *)string.capacity);
          if (iVar1 == 0) {
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0x9d4);
            if (string.deallocator == (ACUtilsDeallocator)0x10) {
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x9d4);
              string_00.deallocator = string.deallocator;
              string_00.reallocator = string.reallocator;
              string_00.size = string.size;
              string_00.capacity = string.capacity;
              string_00.buffer = in_stack_fffffffffffffec0;
              private_ACUtilsTest_AString_destructTestString(string_00);
              return;
            }
            _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,0x9d4,"Assertion \'_ck_x == _ck_y\' failed",
                              "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                              "(string).size == strlen(\"xxxx01234567xxxx\")","(string).size",
                              string.deallocator,"strlen(\"xxxx01234567xxxx\")",0x10,0);
          }
        }
        _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x9d4,
                          "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                          ,"Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s",
                          "(string).buffer == (\"xxxx01234567xxxx\")","(string).buffer",_ck_y_q_1,
                          _ck_y_s_1,_ck_y_q_1,"(\"xxxx01234567xxxx\")","\"","xxxx01234567xxxx","\"",
                          0);
      }
      _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0x9d4,"Assertion \'_ck_x != NULL\' failed",
                        "Assertion \'%s\' failed: %s == %#x","(void*) (string).buffer != NULL",
                        "(void*) (string).buffer",0,0);
    }
  }
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,0x9d0,
                    "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                    ,"Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s",
                    "(string).buffer == (\"xxxx01234567xxxx\")","(string).buffer",_ck_y_q,_ck_y_s,
                    _ck_y_q,"(\"xxxx01234567xxxx\")","\"","xxxx01234567xxxx","\"",0);
}

Assistant:

END_TEST
START_TEST(test_AString_substring_reallocationFailed)
{
    struct AString string = private_ACUtilsTest_AString_constructTestString("xxxx01234567xxxx", 16);
    struct AString *substring;
    private_ACUtilsTest_AString_setReallocFail(true, 0);
    substring = AString_substring(&string, 0, -1);
    ACUTILSTEST_ASSERT_PTR_NULL(substring);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string, "xxxx01234567xxxx", 16);
    private_ACUtilsTest_AString_setReallocFail(true, 1);
    substring = AString_substring(&string, 0, -1);
    ACUTILSTEST_ASSERT_PTR_NULL(substring);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string, "xxxx01234567xxxx", 16);
    private_ACUtilsTest_AString_destructTestString(string);
}